

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O2

string * __thiscall
adios2::core::StructDefinition::Name_abi_cxx11_
          (string *__return_storage_ptr__,StructDefinition *this,size_t index)

{
  pointer pSVar1;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pSVar1 = (this->m_Definition).
           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_Definition).
                     super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= index) {
    std::__cxx11::string::string((string *)&local_38,"core",&local_99);
    std::__cxx11::string::string((string *)&local_58,"VariableStruct::StructDefinition",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"Name",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"invalid index",&local_9c);
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pSVar1 = (this->m_Definition).
             super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(pSVar1 + index));
  return __return_storage_ptr__;
}

Assistant:

std::string StructDefinition::Name(const size_t index) const
{
    if (index >= m_Definition.size())
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "Name",
                                             "invalid index");
    }
    return m_Definition[index].Name;
}